

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rand.cpp
# Opt level: O2

uint32 __thiscall crnlib::ranctx::next(ranctx *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint32 uVar4;
  int iVar5;
  
  uVar1 = this->b;
  uVar2 = this->c;
  uVar3 = (uVar2 << 0x11 | uVar2 >> 0xf) ^ uVar1;
  iVar5 = this->a - (uVar1 << 0x1b | uVar1 >> 5);
  this->a = uVar3;
  this->b = uVar2 + this->d;
  this->c = this->d + iVar5;
  uVar4 = uVar3 + iVar5;
  this->d = uVar4;
  return uVar4;
}

Assistant:

inline uint32 ranctx::next()
    {
        uint32 e = a - rot(b, 27);
        a = b ^ rot(c, 17);
        b = c + d;
        c = d + e;
        d = e + a;
        return d;
    }